

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_end(nk_context *ctx)

{
  nk_property_state *__s;
  nk_edit_state *__s_00;
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  nk_panel_type nVar6;
  undefined4 uVar7;
  uint uVar8;
  nk_window *pnVar9;
  nk_panel *pnVar10;
  nk_panel *pnVar11;
  nk_window *pnVar12;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var13;
  nk_size nVar14;
  nk_size nVar15;
  nk_size nVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  nk_panel *pnVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  void *pvVar23;
  uint *puVar24;
  nk_panel *pnVar25;
  nk_page_element *pe;
  nk_window *pnVar26;
  nk_context *in;
  ulong uVar27;
  nk_command_buffer *b;
  bool bVar28;
  float fVar29;
  nk_vec2 nVar30;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float scroll_step;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect r_00;
  nk_flags state;
  nk_rect empty_east;
  nk_flags *local_140;
  nk_style *local_108;
  nk_flags local_ec;
  float local_e8;
  float fStack_e4;
  undefined8 uStack_e0;
  nk_rect local_d8;
  float local_c8;
  float fStack_c4;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  nk_rect local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ulong local_68;
  undefined8 uStack_60;
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x43cd,"void nk_end(struct nk_context *)");
  }
  pnVar9 = ctx->current;
  if (pnVar9 == (nk_window *)0x0) {
    __assert_fail("ctx->current && \"if this triggers you forgot to call `nk_begin`\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x43ce,"void nk_end(struct nk_context *)");
  }
  pnVar10 = pnVar9->layout;
  if (pnVar10 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x43cf,"void nk_end(struct nk_context *)");
  }
  nVar6 = pnVar10->type;
  if (nVar6 == NK_PANEL_WINDOW) {
    if ((pnVar9->flags & 0x1000) != 0) goto LAB_00129a66;
    in = (nk_context *)0x0;
    if ((pnVar10->flags & 0x800) == 0) {
      in = ctx;
    }
LAB_00128b2b:
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&pnVar9->buffer,r);
    nVar6 = pnVar10->type;
    uVar21 = pnVar10->flags;
  }
  else {
    uVar21 = pnVar10->flags;
    in = (nk_context *)0x0;
    if ((uVar21 >> 0xb & 1) == 0) {
      in = ctx;
    }
    if ((nVar6 & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
                 NK_PANEL_GROUP)) == 0) goto LAB_00128b2b;
  }
  local_108 = &ctx->style;
  local_140 = &pnVar10->flags;
  b = &pnVar9->buffer;
  nVar30 = (ctx->style).window.scrollbar_size;
  local_e8 = nVar30.x;
  fStack_e4 = nVar30.y;
  uStack_e0 = 0;
  nVar30 = nk_panel_get_padding(local_108,nVar6);
  local_c8 = nVar30.x;
  fStack_c4 = nVar30.y;
  fVar29 = (pnVar10->row).height + pnVar10->at_y;
  pnVar10->at_y = fVar29;
  uStack_c0 = extraout_XMM0_Qb;
  if ((uVar21 & 0x4400) == 0x400) {
    fVar41 = (pnVar10->bounds).y;
    if (fVar29 < (pnVar10->bounds).h + fVar41) {
      (pnVar10->bounds).h = fVar29 - fVar41;
    }
    rect.y = fVar41;
    rect.x = (pnVar9->bounds).x;
    auVar33._8_8_ = extraout_XMM0_Qb;
    auVar33._0_4_ = nVar30.x;
    auVar33._4_4_ = nVar30.y;
    auVar38._4_12_ = auVar33._4_12_;
    auVar38._0_4_ = (pnVar9->bounds).w;
    rect._8_8_ = auVar38._0_8_;
    nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
    rect_00.w = pnVar10->border + local_c8;
    rect_00.h = (pnVar10->bounds).h;
    rect_00.y = (pnVar10->bounds).y;
    rect_00.x = (pnVar9->bounds).x;
    nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
    rect_01.x = ((pnVar10->bounds).x + (pnVar10->bounds).w) - pnVar10->border;
    rect_01.y = (pnVar10->bounds).y;
    fVar41 = pnVar10->border + local_c8;
    fVar29 = (pnVar10->bounds).h;
    auVar39._4_4_ = fVar29;
    auVar39._0_4_ = fVar41;
    auVar39._8_8_ = 0;
    if ((*pnVar10->offset_y == 0) && ((*local_140 & 0x20) == 0)) {
      auVar39._0_4_ = fVar41 + local_e8;
      auVar39._8_8_ = 0;
    }
    rect_01._8_8_ = auVar39._0_8_;
    nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
    uVar21 = pnVar10->flags;
    if ((uVar21 & 0x20) == 0 && *pnVar10->offset_x != 0) {
      rect_02.y = (pnVar10->bounds).y + (pnVar10->bounds).h;
      rect_02.x = (pnVar9->bounds).x;
      auVar17._4_4_ = fStack_e4;
      auVar17._0_4_ = local_e8;
      auVar17._8_8_ = uStack_e0;
      auVar40._4_12_ = auVar17._4_12_;
      auVar40._0_4_ = (pnVar9->bounds).w;
      rect_02._8_8_ = auVar40._0_8_;
      nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
      uVar21 = pnVar10->flags;
    }
  }
  if (((uVar21 & 0x4020) == 0) &&
     (pnVar9->scrollbar_hiding_timer <= 4.0 && pnVar9->scrollbar_hiding_timer != 4.0)) {
    local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
    fVar29 = (pnVar10->bounds).y;
    scroll.x = (pnVar10->bounds).x + (pnVar10->bounds).w + local_c8;
    scroll.y = fVar29;
    fVar41 = (pnVar10->bounds).h;
    uVar21 = *pnVar10->offset_y;
    scroll.h = fVar41;
    scroll.w = local_e8;
    fVar42 = pnVar10->at_y;
    if ((pnVar10->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == 0) {
      if (pnVar9 == ctx->active) {
        bVar28 = pnVar10->has_scrolling != 0;
      }
      else {
        bVar28 = false;
      }
      if ((in == (nk_context *)0x0) || ((0.0 < (in->input).mouse.scroll_delta & bVar28) != 1)) {
        pnVar9->scrolled = 0;
      }
      else {
        pnVar9->scrolled = 1;
LAB_00128eb9:
        bVar28 = true;
      }
    }
    else {
      pnVar11 = pnVar9->layout;
      pnVar19 = pnVar11;
      do {
        pnVar25 = pnVar19;
        pnVar19 = pnVar25->parent;
        pnVar12 = pnVar9;
      } while (pnVar25->parent != (nk_panel *)0x0);
      do {
        pnVar26 = pnVar12;
        pnVar12 = pnVar26->parent;
      } while (pnVar12 != (nk_window *)0x0);
      if (((pnVar26 == ctx->active) && (pnVar10->has_scrolling != 0)) && (in != (nk_context *)0x0))
      {
        uVar2 = (pnVar10->bounds).x;
        uVar4 = (pnVar10->bounds).y;
        fVar44 = (in->input).mouse.pos.x;
        bVar28 = false;
        if ((float)uVar2 <= fVar44) {
          uVar3 = (pnVar10->bounds).w;
          uVar5 = (pnVar10->bounds).h;
          if (fVar44 <= (float)uVar2 + (float)uVar3) {
            fVar44 = (in->input).mouse.pos.y;
            bVar28 = false;
            if (((float)uVar4 <= fVar44) && (fVar44 <= (float)uVar4 + (float)uVar5)) {
              fVar44 = (pnVar25->clip).x;
              if (((fVar44 <= (float)uVar2 + (float)uVar3) &&
                  (((float)uVar2 <= fVar44 + (pnVar25->clip).w &&
                   (fVar44 = (pnVar25->clip).y, fVar44 <= fVar41 + fVar29)))) &&
                 (fVar29 <= fVar44 + (pnVar25->clip).h)) {
                for (pnVar19 = pnVar11->parent; pnVar19 != (nk_panel *)0x0;
                    pnVar19 = pnVar19->parent) {
                  pnVar11->has_scrolling = 0;
                  pnVar11 = pnVar19;
                }
                pnVar11->has_scrolling = 0;
                goto LAB_00128eb9;
              }
              goto LAB_00128d83;
            }
          }
        }
      }
      else {
LAB_00128d83:
        bVar28 = false;
      }
    }
    fVar29 = nk_do_scrollbarv((nk_flags *)&local_d8,b,scroll,(uint)bVar28,(float)uVar21,
                              (float)(int)(fVar42 - fVar29),fVar41 * 0.1,fVar41 * 0.01,
                              &(ctx->style).scrollv,&in->input,(ctx->style).font);
    *pnVar10->offset_y = (nk_uint)(long)fVar29;
    if ((in != (nk_context *)0x0) && (bVar28 != false)) {
      (in->input).mouse.scroll_delta = 0.0;
    }
    local_ec = 0;
    fVar29 = (pnVar10->bounds).x;
    fVar44 = (pnVar10->bounds).y + (pnVar10->bounds).h;
    bounds._0_8_ = CONCAT44(fVar44,fVar29);
    fVar41 = pnVar10->max_x;
    fVar42 = (float)(int)(fVar41 - fVar29);
    font = (ctx->style).font;
    local_d8.h = 1.0;
    if (1.0 <= fStack_e4) {
      local_d8.h = fStack_e4;
    }
    fVar45 = local_d8.h + local_d8.h;
    fVar43 = (pnVar10->bounds).w;
    fVar37 = fVar45;
    if (fVar45 <= fVar43) {
      fVar37 = fVar43;
    }
    local_d8._0_8_ = bounds._0_8_;
    local_d8.w = fVar37;
    fVar43 = 0.0;
    if (fVar37 < fVar42) {
      fVar43 = (float)*pnVar10->offset_x;
      scroll_step = fVar41 * 0.05;
      local_50.y = fVar44;
      local_50.h = local_d8.h;
      if ((ctx->style).scrollh.show_buttons != 0) {
        local_78 = ZEXT416((uint)fVar45);
        local_98 = ZEXT416((uint)fVar44);
        fVar44 = scroll_step;
        if (fVar41 * 0.005 <= scroll_step) {
          fVar44 = fVar41 * 0.005;
        }
        local_b8 = ZEXT416((uint)local_d8.h);
        local_88 = CONCAT412(local_d8.h,CONCAT48(local_d8.h,CONCAT44(local_d8.h,local_d8.h)));
        uStack_60 = 0;
        bounds.w = local_d8.h;
        bounds.h = local_d8.h;
        local_68 = bounds._0_8_;
        iVar20 = nk_do_button_symbol((nk_flags *)&local_a8,b,bounds,(ctx->style).scrollh.dec_symbol,
                                     NK_BUTTON_REPEATER,&(ctx->style).scrollh.dec_button,&in->input,
                                     font);
        auVar33 = local_88;
        fVar41 = 0.0;
        if (iVar20 != 0) {
          fVar41 = fVar44;
        }
        fVar43 = fVar43 - fVar41;
        fVar41 = fVar29 + fVar37;
        fVar37 = fVar37 - (float)local_78._0_4_;
        auVar18._8_8_ = uStack_60;
        auVar18._0_8_ = local_68;
        auVar31._4_12_ = auVar18._4_12_;
        auVar31._0_4_ = fVar41 - (float)local_b8._0_4_;
        bounds_00._0_8_ = auVar31._0_8_;
        bounds_00.w = (float)local_88._0_4_;
        bounds_00.h = (float)local_88._4_4_;
        local_88 = auVar33;
        iVar20 = nk_do_button_symbol((nk_flags *)&local_a8,b,bounds_00,
                                     (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                     &(ctx->style).scrollh.inc_button,&in->input,font);
        if (iVar20 != 0) {
          fVar43 = fVar43 + fVar44;
        }
        fVar29 = fVar29 + (float)local_b8._0_4_;
        local_d8.x = fVar29;
        local_50.y = (float)local_98._0_4_;
        local_50.h = (float)local_b8._0_4_;
      }
      if (fVar37 <= scroll_step) {
        scroll_step = fVar37;
      }
      if (fVar42 - fVar37 <= fVar43) {
        fVar43 = fVar42 - fVar37;
      }
      fVar41 = 0.0;
      if (0.0 <= fVar43) {
        fVar41 = fVar43;
      }
      fVar44 = (ctx->style).scrollh.border;
      nVar30 = (ctx->style).scrollh.padding;
      fVar43 = nVar30.x;
      fVar45 = nVar30.y;
      local_a8.x = (fVar41 / fVar42) * fVar37 + fVar29 + fVar44 + fVar43;
      local_a8.y = local_50.y + fVar44 + fVar45;
      local_a8.w = (fVar37 / fVar42) * fVar37 - (fVar43 + fVar43 + fVar44 + fVar44);
      local_a8.h = local_50.h - (fVar45 + fVar45 + fVar44 + fVar44);
      local_50.x = local_a8.w + local_a8.x;
      local_40.w = local_a8.x - fVar29;
      local_50.w = (fVar29 + fVar37) - local_50.x;
      local_d8.w = fVar37;
      local_40.x = fVar29;
      local_40.y = local_50.y;
      local_40.h = local_50.h;
      fVar41 = nk_scrollbar_behavior
                         (&local_ec,&in->input,0,&local_d8,&local_a8,&local_40,&local_50,fVar41,
                          fVar42,scroll_step,NK_HORIZONTAL);
      local_b8._0_4_ = fVar41;
      local_a8.x = (fVar41 / fVar42) * fVar37 + fVar29;
      p_Var13 = (ctx->style).scrollh.draw_begin;
      if (p_Var13 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var13)(b,(ctx->style).scrollh.userdata);
      }
      nk_draw_scrollbar(b,local_ec,&(ctx->style).scrollh,&local_d8,&local_a8);
      p_Var13 = (ctx->style).scrollh.draw_end;
      if (p_Var13 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var13)(b,(ctx->style).scrollh.userdata);
      }
      fVar43 = (float)local_b8._0_4_;
    }
    *pnVar10->offset_x = (nk_uint)(long)fVar43;
  }
  if ((pnVar9->flags & 0x80) == 0) {
LAB_001292f6:
    pnVar9->scrollbar_hiding_timer = 0.0;
  }
  else {
    if ((((ctx->input).mouse.delta.x != 0.0) || (fVar29 = (ctx->input).mouse.delta.y, fVar29 != 0.0)
        ) || (NAN(fVar29))) {
      iVar20 = nk_window_is_hovered(ctx);
      bVar28 = iVar20 != 0;
LAB_00129335:
      if ((bVar28) || ((ctx->last_widget_state & 2) != 0)) goto LAB_001292f6;
    }
    else {
      fVar29 = (ctx->input).mouse.scroll_delta;
      iVar20 = nk_window_is_hovered(ctx);
      bVar28 = iVar20 != 0;
      if (fVar29 != 0.0 || !bVar28) goto LAB_00129335;
    }
    pnVar9->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar9->scrollbar_hiding_timer;
  }
  uVar21 = *local_140;
  if ((uVar21 & 1) != 0) {
    nVar6 = pnVar10->type;
    lVar22 = 0x1cc4;
    if ((int)nVar6 < 0x20) {
      if (nVar6 == NK_PANEL_GROUP) {
        lVar22 = 0x1cd8;
      }
      else if (nVar6 == NK_PANEL_POPUP) {
        lVar22 = 0x1cc8;
      }
      else if (nVar6 == NK_PANEL_CONTEXTUAL) {
        lVar22 = 0x1cd0;
      }
    }
    else if (nVar6 == NK_PANEL_COMBO) {
      lVar22 = 0x1ccc;
    }
    else if ((nVar6 == NK_PANEL_MENU) || (nVar6 == NK_PANEL_TOOLTIP)) {
      lVar22 = 0x1cd4;
    }
    if ((uVar21 >> 0xe & 1) == 0) {
      if ((uVar21 >> 10 & 1) == 0) {
        fVar29 = (pnVar9->bounds).y;
        fVar41 = (pnVar9->bounds).h + fVar29;
      }
      else {
        fVar41 = (pnVar10->bounds).y + (pnVar10->bounds).h + pnVar10->footer_height;
        fVar29 = (pnVar9->bounds).y;
      }
    }
    else {
      fVar29 = (pnVar9->bounds).y;
      fVar41 = (ctx->style).window.border + fVar29 + pnVar10->header_height;
    }
    uVar7 = *(undefined4 *)((long)local_108->cursors + lVar22 + -8);
    fVar42 = (pnVar9->bounds).x;
    fVar44 = (pnVar9->bounds).w;
    fVar43 = pnVar10->border;
    pvVar23 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
    if (pvVar23 != (void *)0x0) {
      *(short *)((long)pvVar23 + 0x10) = (short)(int)fVar43;
      auVar32._0_4_ = (int)fVar42;
      auVar32._4_4_ = (int)fVar29;
      auVar32._8_4_ = (int)(fVar44 + fVar42);
      auVar32._12_4_ = (int)fVar29;
      auVar33 = packssdw(auVar32,auVar32);
      *(long *)((long)pvVar23 + 0x12) = auVar33._0_8_;
      *(undefined4 *)((long)pvVar23 + 0x1a) = uVar7;
    }
    fVar29 = (pnVar9->bounds).x;
    fVar42 = (pnVar9->bounds).w;
    fVar44 = pnVar10->border;
    pvVar23 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
    if (pvVar23 != (void *)0x0) {
      auVar34._0_4_ = (uint)fVar44;
      auVar34._4_4_ = (int)fVar29;
      auVar34._8_4_ = (int)fVar41;
      auVar34._12_4_ = (int)(fVar42 + fVar29);
      auVar33 = packssdw(auVar34,auVar34);
      *(ulong *)((long)pvVar23 + 0x10) =
           (ulong)auVar34._0_4_ & 0xffff | auVar33._0_8_ & 0xffffffffffff0000;
      *(short *)((long)pvVar23 + 0x18) = (short)auVar34._8_4_;
      *(undefined4 *)((long)pvVar23 + 0x1a) = uVar7;
    }
    fVar29 = (pnVar9->bounds).x;
    fVar42 = (pnVar9->bounds).y;
    fVar44 = pnVar10->border;
    pvVar23 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
    if (pvVar23 != (void *)0x0) {
      fVar29 = fVar44 * 0.5 + fVar29;
      *(short *)((long)pvVar23 + 0x10) = (short)(int)fVar44;
      auVar35._0_4_ = (int)fVar29;
      auVar35._4_4_ = (int)fVar42;
      auVar35._8_4_ = (int)fVar29;
      auVar35._12_4_ = (int)fVar41;
      auVar33 = packssdw(auVar35,auVar35);
      *(long *)((long)pvVar23 + 0x12) = auVar33._0_8_;
      *(undefined4 *)((long)pvVar23 + 0x1a) = uVar7;
    }
    fVar29 = (pnVar9->bounds).x;
    fVar42 = (pnVar9->bounds).y;
    fVar44 = (pnVar9->bounds).w;
    fVar43 = pnVar10->border;
    pvVar23 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
    if (pvVar23 != (void *)0x0) {
      fVar29 = fVar43 * -0.5 + fVar29 + fVar44;
      *(short *)((long)pvVar23 + 0x10) = (short)(int)fVar43;
      auVar36._0_4_ = (int)fVar29;
      auVar36._4_4_ = (int)fVar42;
      auVar36._8_4_ = (int)fVar29;
      auVar36._12_4_ = (int)fVar41;
      auVar33 = packssdw(auVar36,auVar36);
      *(long *)((long)pvVar23 + 0x12) = auVar33._0_8_;
      *(undefined4 *)((long)pvVar23 + 0x1a) = uVar7;
    }
  }
  if (((*local_140 & 0x4004) == 4) && (in != (nk_context *)0x0)) {
    fStack_c4 = (pnVar10->bounds).y + (pnVar10->bounds).h;
    local_c8 = (pnVar10->bounds).x + (pnVar10->bounds).w + local_c8;
    if ((*local_140 & 0x20) != 0) {
      local_c8 = local_c8 - local_e8;
    }
    uStack_c0 = 0;
    if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
      r_00.y = fStack_c4;
      r_00.x = local_c8;
      r_00.h = fStack_e4;
      r_00.w = local_e8;
      nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
    }
    else {
      nk_fill_triangle(b,local_e8 + local_c8,fStack_c4,local_e8 + local_c8,fStack_e4 + fStack_c4,
                       local_c8,fStack_e4 + fStack_c4,(ctx->style).window.scaler.data.color);
    }
    if ((((((pnVar9->flags & 0x800) == 0) &&
          (fVar29 = (in->input).mouse.buttons[0].clicked_pos.x, local_c8 <= fVar29)) &&
         (fVar29 <= local_e8 + local_c8)) &&
        ((fVar29 = (in->input).mouse.buttons[0].clicked_pos.y, fStack_c4 <= fVar29 &&
         (fVar29 <= fStack_e4 + fStack_c4)))) && ((in->input).mouse.buttons[0].down == 1)) {
      fVar29 = (in->input).mouse.delta.x;
      fVar42 = (pnVar9->bounds).w + fVar29;
      fVar41 = (ctx->style).window.min_size.x;
      if (fVar42 <= fVar41) {
        fVar42 = fVar41;
      }
      fVar41 = (ctx->style).window.min_size.y;
      (pnVar9->bounds).w = fVar42;
      if ((pnVar10->flags & 0x400) == 0) {
        fVar42 = (in->input).mouse.delta.y;
        fVar44 = (pnVar9->bounds).h + fVar42;
        if (fVar44 <= fVar41) {
          fVar44 = fVar41;
        }
        (pnVar9->bounds).h = fVar44;
      }
      else {
        fVar42 = (in->input).mouse.delta.y;
      }
      (ctx->style).cursor_active = (ctx->style).cursors[6];
      nVar30.x = local_e8 * 0.5 + local_c8 + fVar29;
      nVar30.y = fStack_e4 * 0.5 + fStack_c4 + fVar42;
      (in->input).mouse.buttons[0].clicked_pos = nVar30;
    }
  }
  uVar21 = pnVar10->flags;
  if ((pnVar10->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == 0) {
    if ((uVar21 >> 0xc & 1) == 0) {
      (pnVar9->buffer).end = (ctx->memory).allocated;
      pnVar11 = pnVar9->layout;
      if ((pnVar11->popup_buffer).active != 0) {
        pvVar23 = (ctx->memory).memory.ptr;
        nVar14 = (pnVar11->popup_buffer).last;
        nVar15 = (pnVar9->buffer).last;
        nVar16 = (pnVar11->popup_buffer).end;
        *(nk_size *)((long)pvVar23 + (pnVar11->popup_buffer).parent + 8) = nVar16;
        *(undefined8 *)((long)pvVar23 + nVar14 + 8) = *(undefined8 *)((long)pvVar23 + nVar15 + 8);
        *(nk_size *)((long)pvVar23 + nVar15 + 8) = (pnVar11->popup_buffer).begin;
        (pnVar9->buffer).last = nVar14;
        (pnVar9->buffer).end = nVar16;
        (pnVar11->popup_buffer).active = 0;
      }
    }
    else {
      (pnVar9->buffer).begin = 0;
      (pnVar9->buffer).end = 0;
      (pnVar9->buffer).last = 0;
      (pnVar9->buffer).clip = nk_null_rect;
      uVar21 = *local_140;
    }
  }
  if ((short)uVar21 < 0) {
    uVar21 = uVar21 & 0xffff77ff;
    *local_140 = uVar21;
  }
  pnVar9->flags = uVar21;
  iVar20 = (pnVar9->property).active;
  if (iVar20 == 0) {
    uVar21 = (pnVar9->property).seq;
LAB_00129944:
    (pnVar9->property).old = uVar21;
    (pnVar9->property).prev = iVar20;
    (pnVar9->property).seq = 0;
  }
  else {
    uVar8 = (pnVar9->property).seq;
    uVar21 = (pnVar9->property).old;
    if ((uVar21 == uVar8) || (uVar21 = uVar8, iVar20 != (pnVar9->property).prev)) goto LAB_00129944;
    __s = &pnVar9->property;
    uVar27 = (ulong)__s & 3;
    if (uVar27 == 0) {
      (pnVar9->property).name = 0;
      (pnVar9->property).seq = 0;
      (pnVar9->property).old = 0;
      (pnVar9->property).state = 0;
      (pnVar9->property).buffer[0x38] = '\0';
      (pnVar9->property).buffer[0x39] = '\0';
      (pnVar9->property).buffer[0x3a] = '\0';
      (pnVar9->property).buffer[0x3b] = '\0';
      (pnVar9->property).buffer[0x3c] = '\0';
      (pnVar9->property).buffer[0x3d] = '\0';
      (pnVar9->property).buffer[0x3e] = '\0';
      (pnVar9->property).buffer[0x3f] = '\0';
      (pnVar9->property).length = 0;
      (pnVar9->property).cursor = 0;
      (pnVar9->property).buffer[0x28] = '\0';
      (pnVar9->property).buffer[0x29] = '\0';
      (pnVar9->property).buffer[0x2a] = '\0';
      (pnVar9->property).buffer[0x2b] = '\0';
      (pnVar9->property).buffer[0x2c] = '\0';
      (pnVar9->property).buffer[0x2d] = '\0';
      (pnVar9->property).buffer[0x2e] = '\0';
      (pnVar9->property).buffer[0x2f] = '\0';
      (pnVar9->property).buffer[0x30] = '\0';
      (pnVar9->property).buffer[0x31] = '\0';
      (pnVar9->property).buffer[0x32] = '\0';
      (pnVar9->property).buffer[0x33] = '\0';
      (pnVar9->property).buffer[0x34] = '\0';
      (pnVar9->property).buffer[0x35] = '\0';
      (pnVar9->property).buffer[0x36] = '\0';
      (pnVar9->property).buffer[0x37] = '\0';
      (pnVar9->property).buffer[0x18] = '\0';
      (pnVar9->property).buffer[0x19] = '\0';
      (pnVar9->property).buffer[0x1a] = '\0';
      (pnVar9->property).buffer[0x1b] = '\0';
      (pnVar9->property).buffer[0x1c] = '\0';
      (pnVar9->property).buffer[0x1d] = '\0';
      (pnVar9->property).buffer[0x1e] = '\0';
      (pnVar9->property).buffer[0x1f] = '\0';
      (pnVar9->property).buffer[0x20] = '\0';
      (pnVar9->property).buffer[0x21] = '\0';
      (pnVar9->property).buffer[0x22] = '\0';
      (pnVar9->property).buffer[0x23] = '\0';
      (pnVar9->property).buffer[0x24] = '\0';
      (pnVar9->property).buffer[0x25] = '\0';
      (pnVar9->property).buffer[0x26] = '\0';
      (pnVar9->property).buffer[0x27] = '\0';
      (pnVar9->property).buffer[8] = '\0';
      (pnVar9->property).buffer[9] = '\0';
      (pnVar9->property).buffer[10] = '\0';
      (pnVar9->property).buffer[0xb] = '\0';
      (pnVar9->property).buffer[0xc] = '\0';
      (pnVar9->property).buffer[0xd] = '\0';
      (pnVar9->property).buffer[0xe] = '\0';
      (pnVar9->property).buffer[0xf] = '\0';
      (pnVar9->property).buffer[0x10] = '\0';
      (pnVar9->property).buffer[0x11] = '\0';
      (pnVar9->property).buffer[0x12] = '\0';
      (pnVar9->property).buffer[0x13] = '\0';
      (pnVar9->property).buffer[0x14] = '\0';
      (pnVar9->property).buffer[0x15] = '\0';
      (pnVar9->property).buffer[0x16] = '\0';
      (pnVar9->property).buffer[0x17] = '\0';
      __s->active = 0;
      __s->prev = 0;
      (pnVar9->property).buffer[0] = '\0';
      (pnVar9->property).buffer[1] = '\0';
      (pnVar9->property).buffer[2] = '\0';
      (pnVar9->property).buffer[3] = '\0';
      (pnVar9->property).buffer[4] = '\0';
      (pnVar9->property).buffer[5] = '\0';
      (pnVar9->property).buffer[6] = '\0';
      (pnVar9->property).buffer[7] = '\0';
    }
    else {
      memset(__s,0,4 - uVar27);
      puVar1 = (undefined8 *)((long)__s + (4 - uVar27));
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      puVar1[5] = 0;
      puVar1[6] = 0;
      puVar1[7] = 0;
      puVar1[8] = 0;
      puVar1[9] = 0;
      *(undefined8 *)((long)puVar1 + 0x4c) = 0;
      *(undefined8 *)((long)puVar1 + 0x54) = 0;
      memset((void *)((long)puVar1 + 0x5c),0,uVar27);
    }
  }
  iVar20 = (pnVar9->edit).active;
  if (iVar20 == 0) {
    uVar21 = (pnVar9->edit).seq;
LAB_001299dd:
    (pnVar9->edit).old = uVar21;
    (pnVar9->edit).prev = iVar20;
    (pnVar9->edit).seq = 0;
  }
  else {
    uVar8 = (pnVar9->edit).seq;
    uVar21 = (pnVar9->edit).old;
    if ((uVar21 == uVar8) || (uVar21 = uVar8, iVar20 != (pnVar9->edit).prev)) goto LAB_001299dd;
    __s_00 = &pnVar9->edit;
    uVar27 = (ulong)__s_00 & 3;
    if (uVar27 == 0) {
      (pnVar9->edit).sel_end = 0;
      (pnVar9->edit).scrollbar.x = 0;
      *(undefined8 *)&(pnVar9->edit).scrollbar.y = 0;
      (pnVar9->edit).prev = 0;
      (pnVar9->edit).cursor = 0;
      (pnVar9->edit).sel_start = 0;
      (pnVar9->edit).sel_end = 0;
      __s_00->name = 0;
      __s_00->seq = 0;
      (pnVar9->edit).old = 0;
      (pnVar9->edit).active = 0;
    }
    else {
      memset(__s_00,0,4 - uVar27);
      puVar1 = (undefined8 *)((long)__s_00 + (4 - uVar27));
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      memset(puVar1 + 5,0,uVar27);
    }
  }
  if ((pnVar9->popup).active_con == 0) {
    uVar21 = (pnVar9->popup).con_count;
LAB_00129a2b:
    puVar24 = &(pnVar9->popup).con_count;
    (pnVar9->popup).con_old = uVar21;
  }
  else {
    uVar21 = (pnVar9->popup).con_old;
    if (uVar21 == (pnVar9->popup).con_count) goto LAB_00129a2b;
    puVar24 = &(pnVar9->popup).active_con;
    (pnVar9->popup).con_count = 0;
    (pnVar9->popup).con_old = 0;
  }
  *puVar24 = 0;
  (pnVar9->popup).combo_count = 0;
  if ((pnVar10->row).tree_depth != 0) {
    __assert_fail("!layout->row.tree_depth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x41f2,"void nk_panel_end(struct nk_context *)");
  }
  nk_free_page_element(ctx,(nk_page_element *)ctx->current->layout);
LAB_00129a66:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    struct nk_panel *layout;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    NK_ASSERT(ctx->current->layout);

    layout = ctx->current->layout;
    if (!ctx || !ctx->current) return;
    if (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN)) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}